

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_Error tt_cmap6_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  
  if (valid->limit < table + 10) {
    ft_validator_error(valid,8);
  }
  uVar3 = *(ushort *)(table + 2) << 8 | *(ushort *)(table + 2) >> 8;
  bVar1 = table[8];
  bVar2 = table[9];
  iVar4 = (uint)bVar1 * 0x100 + (uint)bVar2;
  if ((valid->limit < table + uVar3) || ((uint)uVar3 < iVar4 * 2 + 10U)) {
    ft_validator_error(valid,8);
  }
  if ((valid->level != FT_VALIDATE_DEFAULT) && (iVar4 != 0)) {
    lVar5 = 0;
    do {
      uVar3 = *(ushort *)(table + 10 + lVar5 * 2);
      if ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)(ushort)(uVar3 << 8 | uVar3 >> 8)) {
        ft_validator_error(valid,0x10);
      }
      lVar5 = lVar5 + 1;
    } while ((uint)CONCAT11(bVar1,bVar2) != (uint)lVar5);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap6_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length, count;


    if ( table + 10 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;
    length = TT_NEXT_USHORT( p );

    p      = table + 8;             /* skip language and start index */
    count  = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 10 + count * 2 )
      FT_INVALID_TOO_SHORT;

    /* check glyph indices */
    if ( valid->level >= FT_VALIDATE_TIGHT )
    {
      FT_UInt  gindex;


      for ( ; count > 0; count-- )
      {
        gindex = TT_NEXT_USHORT( p );
        if ( gindex >= TT_VALID_GLYPH_COUNT( valid ) )
          FT_INVALID_GLYPH_ID;
      }
    }

    return FT_Err_Ok;
  }